

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMU_ENCRYPTED_SECRET_Unmarshal
                 (TPMU_ENCRYPTED_SECRET *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  int iVar1;
  long lVar2;
  
  if (selector == 1) {
    if (*size < 0x100) {
      return 0x9a;
    }
    lVar2 = 0x100;
    memcpy(target,*buffer,0x100);
    iVar1 = -0x100;
  }
  else if ((selector == 8) || (selector == 0x25)) {
    if (*size < 0x42) {
      return 0x9a;
    }
    lVar2 = 0x42;
    memcpy(target,*buffer,0x42);
    iVar1 = -0x42;
  }
  else {
    if (selector != 0x23) {
      return 0x98;
    }
    if (*size < 0x44) {
      return 0x9a;
    }
    lVar2 = 0x44;
    memcpy(target,*buffer,0x44);
    iVar1 = -0x44;
  }
  *size = *size + iVar1;
  *buffer = *buffer + lVar2;
  return 0;
}

Assistant:

TPM_RC
TPMU_ENCRYPTED_SECRET_Unmarshal(TPMU_ENCRYPTED_SECRET *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_ECC
        case TPM_ALG_ECC:
            return BYTE_Array_Unmarshal((BYTE *)(target->ecc), buffer, size, (INT32)sizeof(TPMS_ECC_POINT));
#endif // ALG_ECC
#if         ALG_RSA
        case TPM_ALG_RSA:
            return BYTE_Array_Unmarshal((BYTE *)(target->rsa), buffer, size, (INT32)MAX_RSA_KEY_BYTES);
#endif // ALG_RSA
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return BYTE_Array_Unmarshal((BYTE *)(target->symmetric), buffer, size, (INT32)sizeof(TPM2B_DIGEST));
#endif // ALG_SYMCIPHER
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return BYTE_Array_Unmarshal((BYTE *)(target->keyedHash), buffer, size, (INT32)sizeof(TPM2B_DIGEST));
#endif // ALG_KEYEDHASH
    }
    return TPM_RC_SELECTOR;
}